

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_int_pro_col_sse2
               (int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [16];
  int local_10c;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 (*local_c8) [16];
  int local_bc;
  int i;
  __m128i src_line;
  __m128i s1;
  __m128i s0;
  __m128i zero;
  uint8_t *ref_tmp;
  int ht;
  int norm_factor_local;
  int height_local;
  int width_local;
  int ref_stride_local;
  uint8_t *ref_local;
  int16_t *vbuf_local;
  
  for (local_bc = 0; local_bc < height; local_bc = local_bc + 1) {
    local_c8 = (undefined1 (*) [16])(ref + local_bc * ref_stride);
    local_e8 = 0;
    uStack_e0 = 0;
    for (local_10c = 0; zero[1]._0_2_ = (short)local_e8, zero[1]._2_2_ = (short)(local_e8 >> 0x10),
        ref_tmp._0_2_ = (short)uStack_e0, ref_tmp._2_2_ = (short)(uStack_e0 >> 0x10),
        local_10c < width; local_10c = local_10c + 0x10) {
      auVar1 = psadbw(*local_c8,ZEXT816(0));
      s0[1]._0_2_ = auVar1._0_2_;
      s0[1]._2_2_ = auVar1._2_2_;
      zero[0]._0_2_ = auVar1._8_2_;
      zero[0]._2_2_ = auVar1._10_2_;
      local_e8._0_4_ = CONCAT22(zero[1]._2_2_ + s0[1]._2_2_,(short)zero[1] + (short)s0[1]);
      local_e8 = (ulong)(uint)local_e8;
      uStack_e0 = (ulong)CONCAT22(ref_tmp._2_2_ + zero[0]._2_2_,(short)ref_tmp + (short)zero[0]);
      local_c8 = local_c8 + 1;
    }
    local_e8._0_4_ = CONCAT22(zero[1]._2_2_ + ref_tmp._2_2_,(short)zero[1] + (short)ref_tmp);
    vbuf[local_bc] = (int16_t)((int)(uint)local_e8 >> ((byte)norm_factor & 0x1f));
  }
  return;
}

Assistant:

void aom_int_pro_col_sse2(int16_t *vbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width to be multiple of 16.
  assert(width % 16 == 0);

  for (int ht = 0; ht < height; ht++) {
    const uint8_t *ref_tmp = ref + (ht * ref_stride);
    __m128i zero = _mm_setzero_si128();
    __m128i s0 = zero;
    __m128i s1, src_line;
    for (int i = 0; i < width; i += 16) {
      src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      s1 = _mm_sad_epu8(src_line, zero);
      s0 = _mm_add_epi16(s0, s1);
      ref_tmp += 16;
    }

    s1 = _mm_srli_si128(s0, 8);
    s0 = _mm_add_epi16(s0, s1);
    vbuf[ht] = _mm_cvtsi128_si32(s0) >> norm_factor;
  }
}